

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void GEO::expansion::initialize(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  expansion_splitter_ = 1.0;
  bVar3 = true;
  dVar4 = 1.0;
  expansion_epsilon_ = 1.0;
  dVar5 = 1.0;
  do {
    expansion_epsilon_ = expansion_epsilon_ * 0.5;
    if (bVar3) {
      dVar4 = dVar4 + dVar4;
      expansion_splitter_ = dVar4;
    }
    dVar6 = expansion_epsilon_ + 1.0;
    if ((dVar6 == 1.0) && (!NAN(dVar6))) break;
    bVar3 = (bool)(bVar3 ^ 1);
    bVar1 = NAN(dVar5);
    bVar2 = dVar6 != dVar5;
    dVar5 = dVar6;
  } while ((bVar2) || (NAN(dVar6) || bVar1));
  expansion_splitter_ = expansion_splitter_ + 1.0;
  return;
}

Assistant:

void expansion::initialize() {
        // Taken from Jonathan Shewchuk's exactinit.
        double half;
        double check, lastcheck;
        int every_other;

        every_other = 1;
        half = 0.5;
        expansion_epsilon_ = 1.0;
        expansion_splitter_ = 1.0;
        check = 1.0;
        // Repeatedly divide `epsilon' by two until it is too small to add to
        // one without causing roundoff.  (Also check if the sum is equal to
        // the previous sum, for machines that round up instead of using exact
        // rounding.  Not that this library will work on such machines anyway.
        do {
            lastcheck = check;
            expansion_epsilon_ *= half;
            if(every_other) {
                expansion_splitter_ *= 2.0;
            }
            every_other = !every_other;
            check = 1.0 + expansion_epsilon_;
        } while((check != 1.0) && (check != lastcheck));
        expansion_splitter_ += 1.0;
    }